

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TransSetSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::TransSetSyntax,slang::syntax::TransSetSyntax_const&>
          (BumpAllocator *this,TransSetSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TransSetSyntax *pTVar8;
  
  pTVar8 = (TransSetSyntax *)allocate(this,0x70,8);
  (pTVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pTVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pTVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pTVar8->super_SyntaxNode).parent = pSVar1;
  uVar5 = (args->openParen).field_0x2;
  NVar6.raw = (args->openParen).numFlags.raw;
  uVar7 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  (pTVar8->openParen).kind = (args->openParen).kind;
  (pTVar8->openParen).field_0x2 = uVar5;
  (pTVar8->openParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pTVar8->openParen).rawLen = uVar7;
  (pTVar8->openParen).info = pIVar2;
  (pTVar8->ranges).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->ranges).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->ranges).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->ranges).super_SyntaxListBase.super_SyntaxNode.parent;
  (pTVar8->ranges).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->ranges).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pTVar8->ranges).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pTVar8->ranges).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pTVar8->ranges).super_SyntaxListBase.childCount = (args->ranges).super_SyntaxListBase.childCount;
  (pTVar8->ranges).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00b70138;
  sVar3 = (args->ranges).elements._M_extent._M_extent_value;
  (pTVar8->ranges).elements._M_ptr = (args->ranges).elements._M_ptr;
  (pTVar8->ranges).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeParen).field_0x2;
  NVar6.raw = (args->closeParen).numFlags.raw;
  uVar7 = (args->closeParen).rawLen;
  pIVar2 = (args->closeParen).info;
  (pTVar8->closeParen).kind = (args->closeParen).kind;
  (pTVar8->closeParen).field_0x2 = uVar5;
  (pTVar8->closeParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pTVar8->closeParen).rawLen = uVar7;
  (pTVar8->closeParen).info = pIVar2;
  return pTVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }